

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O1

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>,int>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v,int *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_68;
  AssertionHandler local_58;
  
  iVar1 = *args;
  local_68._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_68,capturedExpression,ContinueOnFailure);
  if ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 1) {
    iVar2 = ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_)->value;
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    bVar4 = iVar3 == iVar1;
  }
  else {
    bVar4 = false;
  }
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb35e0;
  local_68._8_8_ = (ulong)CONCAT52(local_68._11_5_,CONCAT11(bVar4,bVar4)) << 8;
  Catch::AssertionHandler::handleExpr(&local_58,&local_68);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}